

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::changeEvent(QWidget *this,QEvent *event)

{
  bool bVar1;
  WidgetAttribute attribute;
  WindowType WVar2;
  QWidgetPrivate *pQVar3;
  ulong uVar4;
  QCoreApplication *pQVar5;
  QStyle *pQVar6;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QEvent styleChangedEvent;
  QAccessibleStateChangeEvent event_1;
  State s;
  undefined4 in_stack_ffffffffffffff90;
  State in_stack_ffffffffffffff98;
  undefined1 *local_50;
  undefined1 *local_48;
  ulong local_40;
  QAccessibleStateChangeEvent local_38 [40];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  attribute = QEvent::type(in_RSI);
  if (attribute == WA_NoChildEventsFromChildren) {
    update(in_RDI);
    goto LAB_0037cd1f;
  }
  if (attribute != WA_StyleSheet) {
    if (attribute == WA_ShowWithoutActivating) {
      update(in_RDI);
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessible::State::State((State *)0x37cb90);
      local_10 = (undefined1 *)((ulong)local_10 & 0xfffffffffffffffe | 1);
      memset(local_38,0xaa,0x28);
      local_40 = (ulong)local_10;
      QAccessibleStateChangeEvent::QAccessibleStateChangeEvent
                ((QAccessibleStateChangeEvent *)CONCAT44(attribute,in_stack_ffffffffffffff90),
                 &in_RDI->super_QObject,in_stack_ffffffffffffff98);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
      QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent(local_38);
      goto LAB_0037cd1f;
    }
    if (attribute != WA_NativeWindow) {
      if ((((attribute == (WA_AlwaysStackOnTop|WA_TintedBackground)) &&
           (uVar4 = QGuiApplication::desktopSettingsAware(), (uVar4 & 1) != 0)) &&
          (WVar2 = windowType((QWidget *)CONCAT44(attribute,in_stack_ffffffffffffff90)),
          WVar2 != Desktop)) &&
         ((pQVar5 = QCoreApplication::instance(), pQVar5 != (QCoreApplication *)0x0 &&
          (uVar4 = QCoreApplication::closingDown(), (uVar4 & 1) == 0)))) {
        bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff98,attribute);
        if (bVar1) {
          pQVar6 = QApplication::style();
          (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,in_RDI);
        }
        bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff98,attribute);
        if (bVar1) {
          pQVar6 = QApplication::style();
          (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,in_RDI);
        }
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_50,StyleChange);
        QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_50);
        bVar1 = isVisible((QWidget *)0x37cd02);
        if (bVar1) {
          update(in_RDI);
        }
        QEvent::~QEvent((QEvent *)&local_50);
      }
      goto LAB_0037cd1f;
    }
  }
  pQVar3 = d_func((QWidget *)0x37cbf1);
  update(in_RDI);
  updateGeometry((QWidget *)CONCAT44(attribute,in_stack_ffffffffffffff90));
  if (pQVar3->layout != (QLayout *)0x0) {
    (**(code **)(*(long *)pQVar3->layout + 0x70))();
  }
LAB_0037cd1f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::changeEvent(QEvent * event)
{
    switch(event->type()) {
    case QEvent::EnabledChange: {
        update();
#if QT_CONFIG(accessibility)
        QAccessible::State s;
        s.disabled = true;
        QAccessibleStateChangeEvent event(this, s);
        QAccessible::updateAccessibility(&event);
#endif
        break;
    }

    case QEvent::FontChange:
    case QEvent::StyleChange: {
        Q_D(QWidget);
        update();
        updateGeometry();
        if (d->layout)
            d->layout->invalidate();
        break;
    }

    case QEvent::PaletteChange:
        update();
        break;

    case QEvent::ThemeChange:
        if (QGuiApplication::desktopSettingsAware() && windowType() != Qt::Desktop
            && qApp && !QCoreApplication::closingDown()) {
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->unpolish(this);
            if (testAttribute(Qt::WA_WState_Polished))
                QApplication::style()->polish(this);
            QEvent styleChangedEvent(QEvent::StyleChange);
            QCoreApplication::sendEvent(this, &styleChangedEvent);
            if (isVisible())
                update();
        }
        break;

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
        updateGeometry();
        break;
#endif

    default:
        break;
    }
}